

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# googletest.h
# Opt level: O0

void __thiscall google::CapturedStream::CapturedStream(CapturedStream *this,int fd,string *filename)

{
  string *filename_local;
  int fd_local;
  CapturedStream *this_local;
  
  this->fd_ = fd;
  glog_internal_namespace_::FileDescriptor::FileDescriptor(&this->uncaptured_fd_);
  std::__cxx11::string::string((string *)&this->filename_,(string *)filename);
  Capture(this);
  return;
}

Assistant:

CapturedStream(int fd, string filename)
      : fd_(fd), filename_(std::move(filename)) {
    Capture();
  }